

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.h
# Opt level: O0

void __thiscall
psql::
channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::write<psql::parse_message>
          (channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *this,parse_message *msg,bool write_msg_type)

{
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s;
  size_t sVar1;
  uchar *new_first;
  mutable_buffer local_50;
  uint local_3c;
  size_type local_38;
  size_t buffer_size;
  size_t effective_size;
  serialization_context ctx;
  bool write_msg_type_local;
  parse_message *msg_local;
  channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  *this_local;
  
  ctx.first_._7_1_ = write_msg_type;
  serialization_context::serialization_context
            ((serialization_context *)&effective_size,(uint8_t *)0x0);
  sVar1 = get_size<psql::parse_message>(msg,(serialization_context *)&effective_size);
  buffer_size = sVar1 + 4;
  local_38 = buffer_size + (long)(int)(uint)((ctx.first_._7_1_ & 1) != 0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->shared_buff_,local_38);
  new_first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->shared_buff_);
  serialization_context::set_first((serialization_context *)&effective_size,new_first);
  if ((ctx.first_._7_1_ & 1) != 0) {
    serialize<unsigned_char>("PHBDESC\x01\x1b\x03;LF",(serialization_context *)&effective_size);
  }
  local_3c = (uint)buffer_size;
  serialize<unsigned_int>(&local_3c,(serialization_context *)&effective_size);
  serialize<psql::parse_message>(msg,(serialization_context *)&effective_size);
  s = this->stream_;
  local_50 = (mutable_buffer)
             boost::asio::buffer<unsigned_char,std::allocator<unsigned_char>>(&this->shared_buff_);
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1>
            (s,(mutable_buffers_1 *)&local_50,(type *)0x0);
  return;
}

Assistant:

void write(const Message& msg, bool write_msg_type=true)
	{
		serialization_context ctx;

		std::size_t effective_size = 4 + get_size(msg, ctx);
		std::size_t buffer_size = effective_size +  (write_msg_type ? 1 : 0);

		shared_buff_.resize(buffer_size);
		ctx.set_first(shared_buff_.data());

		if (write_msg_type)
		{
			serialize(Message::message_type, ctx);
		}
		serialize(std::uint32_t(effective_size), ctx);
		serialize(msg, ctx);

		boost::asio::write(stream_, boost::asio::buffer(shared_buff_));
	}